

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objcxx_eh.cc
# Opt level: O1

_Unwind_Exception * objc_init_cxx_exception(id obj)

{
  undefined8 *puVar1;
  long lVar2;
  _Unwind_Exception *p_Var3;
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = obj;
  p_Var3 = (_Unwind_Exception *)((long)puVar1 - _ZN12_GLOBAL__N_121exception_struct_sizeE_0);
  *(__objc_id_type_info **)((long)&p_Var3->exception_class + _ZN12_GLOBAL__N_116type_info_offsetE_0)
       = &__objc_id_type_info;
  p_Var3->exception_class = cxx_exception_class;
  p_Var3->exception_cleanup = anon_unknown.dwarf_2f31c::exception_cleanup;
  lVar2 = __cxa_get_globals();
  *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
  return p_Var3;
}

Assistant:

struct _Unwind_Exception *objc_init_cxx_exception(id obj)
{
	id *newEx = static_cast<id*>(__cxa_allocate_exception(sizeof(id)));
	*newEx = obj;
	_Unwind_Exception *ex = pointer_add<_Unwind_Exception>(newEx, -exception_struct_size);
	*pointer_add<std::type_info*>(ex, type_info_offset) = &__objc_id_type_info;
	ex->exception_class = cxx_exception_class;
	ex->exception_cleanup = exception_cleanup;
	__cxa_get_globals()->uncaughtExceptions++;
	return ex;
}